

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationLeakyReLU * __thiscall
CoreML::Specification::ActivationParams::mutable_leakyrelu(ActivationParams *this)

{
  bool bVar1;
  ActivationLeakyReLU *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_leakyrelu(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_leakyrelu(this);
    this_00 = (ActivationLeakyReLU *)operator_new(0x18);
    ActivationLeakyReLU::ActivationLeakyReLU(this_00);
    (this->NonlinearityType_).leakyrelu_ = this_00;
  }
  return (ActivationLeakyReLU *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationLeakyReLU* ActivationParams::mutable_leakyrelu() {
  if (!has_leakyrelu()) {
    clear_NonlinearityType();
    set_has_leakyrelu();
    NonlinearityType_.leakyrelu_ = new ::CoreML::Specification::ActivationLeakyReLU;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.leakyReLU)
  return NonlinearityType_.leakyrelu_;
}